

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  uint uVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  difference_type __n;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  size_t __i;
  long lVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  bool bVar14;
  double dVar15;
  int value;
  uniform_int_distribution<int> dis;
  set<int,_std::less<int>,_std::allocator<int>_> all;
  mt19937 gen;
  random_device rd;
  int local_3794;
  double local_3790;
  uint local_3784;
  double local_3780;
  uniform_int_distribution<int> local_3778;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> local_3770 [8];
  undefined4 local_3768 [2];
  undefined8 local_3760;
  undefined4 *local_3758;
  undefined4 *local_3750;
  undefined8 local_3748;
  byte local_3740 [4096];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  uVar3 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar3;
  lVar10 = 1;
  uVar6 = local_2740._M_x[0];
  do {
    uVar6 = (ulong)(((uint)(uVar6 >> 0x1e) ^ (uint)uVar6) * 0x6c078965 + (int)lVar10);
    local_2740._M_x[lVar10] = uVar6;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x270);
  local_2740._M_p = 0x270;
  memset(local_3740,0,0x1000);
  local_3790 = 0.0;
  lVar10 = 0;
  do {
    local_3784 = *(uint *)((long)&DAT_00102058 + lVar10);
    local_3778._M_param._M_a = 1;
    local_3768[0] = 0;
    local_3760 = 0;
    local_3758 = local_3768;
    local_3748 = 0;
    iVar12 = 1000000;
    local_3778._M_param._M_b = local_3784;
    local_3750 = local_3758;
    do {
      local_3794 = std::uniform_int_distribution<int>::operator()
                             (&local_3778,&local_2740,&local_3778._M_param);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(local_3770,&local_3794);
      uVar2 = local_3748;
      uVar3 = local_3794 * 0x16a88000 | (uint)(local_3794 * -0x3361d2af) >> 0x11;
      uVar3 = (uVar3 * -0x194da000 | uVar3 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
      uVar3 = (uVar3 >> 0x10 ^ uVar3 ^ 4) * -0x7a143595;
      uVar4 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
      uVar13 = uVar4 >> 0x10 ^ uVar4;
      uVar3 = 0;
      if ((uVar13 & 1) == 0) {
        bVar14 = (uVar13 & 0xfffe) == 0;
        uVar3 = uVar4 >> 0x10;
        if (!bVar14) {
          uVar3 = uVar13;
        }
        uVar8 = (uint)bVar14 * 0x10;
        uVar9 = uVar8 | 9;
        uVar13 = uVar3 >> 8;
        if ((char)uVar3 != '\0') {
          uVar9 = uVar8 + 1;
          uVar13 = uVar3;
        }
        uVar8 = uVar9 + 4;
        uVar1 = uVar13 >> 4;
        if ((uVar13 & 0xf) != 0) {
          uVar8 = uVar9;
          uVar1 = uVar13;
        }
        uVar3 = uVar8 + 2;
        uVar13 = uVar1 >> 2;
        if ((uVar1 & 3) != 0) {
          uVar3 = uVar8;
          uVar13 = uVar1;
        }
        uVar3 = uVar3 - (uVar13 & 1);
      }
      if (0x13 < uVar3) {
        uVar3 = 0x14;
      }
      uVar13 = uVar3 + 1;
      if (uVar3 + 1 <= (uint)(int)(char)local_3740[uVar4 >> 0x14]) {
        uVar13 = (int)(char)local_3740[uVar4 >> 0x14];
      }
      local_3740[uVar4 >> 0x14] = (byte)uVar13;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
    dVar15 = 0.0;
    lVar7 = 0;
    do {
      dVar15 = dVar15 + (double)(((ulong)local_3740[lVar7] ^ 0x3ff) << 0x34);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x1000);
    dVar15 = 12098218.894406674 / dVar15;
    if (dVar15 <= 10240.0) {
      lVar7 = 0;
      lVar11 = 0;
      do {
        lVar7 = lVar7 + (ulong)(local_3740[lVar11] == 0);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x1000);
      if (lVar7 != 0) {
        dVar15 = 4096.0 / (double)lVar7;
        local_3780 = 4096.0;
        goto LAB_00101504;
      }
    }
    else if (143165576.53333333 < dVar15) {
      dVar15 = dVar15 * -2.3283064365386963e-10 + 1.0;
      local_3780 = -4294967296.0;
LAB_00101504:
      dVar15 = log(dVar15);
      dVar15 = dVar15 * local_3780;
    }
    iVar5 = ((uint)(long)dVar15 |
            (uint)(long)(dVar15 - 9.223372036854776e+18) & (uint)((long)dVar15 >> 0x3f)) -
            (int)uVar2;
    iVar12 = -iVar5;
    if (0 < iVar5) {
      iVar12 = iVar5;
    }
    local_3790 = local_3790 + (double)iVar12 / (double)(int)uVar2;
    printf("%d numbers in range [1 .. %d], %d uniq, %d result, %.5f relative error\n",1000000,
           (ulong)local_3784);
    memset(local_3740,0,0x1000);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_3770);
    lVar10 = lVar10 + 4;
    if (lVar10 == 0x20) {
      printf("Average error: %.5f\n",local_3790 * 0.125);
      printf("Paper estimated error: %.5f\n",0x3f90a3d70a3d70a4);
      std::random_device::_M_fini();
      return 0;
    }
  } while( true );
}

Assistant:

int main() {
    std::random_device rd;
    std::mt19937 gen(rd());

    constexpr int N = (int) 1e6;

    double error_count = 0.0;
    int count = 0;


    hll::hyper_log_log<int, 12> counter{};
    for (int k : {100, 1000, 10000, N / 10, N, N * 10, N * 100, N * 1000}) {
        std::uniform_int_distribution<> dis(1, k);
        std::set<int> all;

        for (int i = 0; i < N; i++) {
            int value = dis(gen);
            all.insert(value);
            counter.add(value);
        }
        int expected = (int) all.size();
        int counter_result = counter.count();
        double error = relative_error(expected, counter_result);
        error_count += error;
        count += 1;
        printf("%d numbers in range [1 .. %d], %d uniq, %d result, %.5f relative error\n", N, k, expected, counter_result, error);

        counter.clear();
    }

    printf("Average error: %.5f\n", error_count / count);
    printf("Paper estimated error: %.5f\n", counter.get_relative_error());
    return 0;
}